

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushRegexp(ParseState *this,Regexp *re)

{
  bool bVar1;
  int iVar2;
  ParseFlags PVar3;
  RegexpOp op;
  pointer pRVar4;
  iterator iVar5;
  Regexp *in_RSI;
  ParseState *in_RDI;
  CharClassBuilder *unaff_retaddr;
  Rune r_1;
  Rune r;
  Regexp *in_stack_00000178;
  CharClassBuilder *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ParseFlags in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  ParseState *in_stack_ffffffffffffffd8;
  Regexp *local_10;
  ParseState *pPVar7;
  Rune RVar6;
  
  pPVar7 = in_RDI;
  MaybeConcatString(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  local_10 = in_RSI;
  if ((in_RSI->op_ == '\x14') && ((in_RSI->field_7).field_1.name_ != (string *)0x0)) {
    CharClassBuilder::RemoveAbove(unaff_retaddr,(Rune)((ulong)pPVar7 >> 0x20));
    iVar2 = CharClassBuilder::size((in_RSI->field_7).field_3.ccb_);
    if (iVar2 == 1) {
      CharClassBuilder::begin(in_stack_ffffffffffffffa8);
      pRVar4 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                         ((_Rb_tree_const_iterator<re2::RuneRange> *)0x24ac3f);
      RVar6 = pRVar4->lo;
      Decref((Regexp *)unaff_retaddr);
      local_10 = (Regexp *)operator_new(0x28);
      Regexp((Regexp *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (RegexpOp)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (ParseFlags)in_stack_ffffffffffffffa8);
      (local_10->field_7).field_0.max_ = RVar6;
    }
    else {
      iVar2 = CharClassBuilder::size((in_RSI->field_7).field_3.ccb_);
      if (iVar2 == 2) {
        iVar5 = CharClassBuilder::begin(in_stack_ffffffffffffffa8);
        RVar6 = (Rune)((ulong)iVar5._M_node >> 0x20);
        pRVar4 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->
                           ((_Rb_tree_const_iterator<re2::RuneRange> *)0x24ace3);
        iVar2 = pRVar4->lo;
        if (((0x40 < iVar2) && (iVar2 < 0x5b)) &&
           (bVar1 = CharClassBuilder::Contains
                              ((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),RVar6),
           bVar1)) {
          Decref((Regexp *)unaff_retaddr);
          local_10 = (Regexp *)operator_new(0x28);
          PVar3 = operator|(in_RDI->flags_,FoldCase);
          Regexp((Regexp *)CONCAT44(PVar3,in_stack_ffffffffffffffb0),
                 (RegexpOp)((ulong)local_10 >> 0x20),(ParseFlags)local_10);
          (local_10->field_7).field_0.max_ = iVar2 + 0x20;
        }
      }
    }
  }
  op = Regexp::op(local_10);
  bVar1 = IsMarker(in_RDI,op);
  if (!bVar1) {
    bVar1 = ComputeSimple(in_stack_00000178);
    local_10->simple_ = bVar1;
  }
  local_10->down_ = in_RDI->stacktop_;
  in_RDI->stacktop_ = local_10;
  return true;
}

Assistant:

bool Regexp::ParseState::PushRegexp(Regexp* re) {
  MaybeConcatString(-1, NoParseFlags);

  // Special case: a character class of one character is just
  // a literal.  This is a common idiom for escaping
  // single characters (e.g., [.] instead of \.), and some
  // analysis does better with fewer character classes.
  // Similarly, [Aa] can be rewritten as a literal A with ASCII case folding.
  if (re->op_ == kRegexpCharClass && re->ccb_ != NULL) {
    re->ccb_->RemoveAbove(rune_max_);
    if (re->ccb_->size() == 1) {
      Rune r = re->ccb_->begin()->lo;
      re->Decref();
      re = new Regexp(kRegexpLiteral, flags_);
      re->rune_ = r;
    } else if (re->ccb_->size() == 2) {
      Rune r = re->ccb_->begin()->lo;
      if ('A' <= r && r <= 'Z' && re->ccb_->Contains(r + 'a' - 'A')) {
        re->Decref();
        re = new Regexp(kRegexpLiteral, flags_ | FoldCase);
        re->rune_ = r + 'a' - 'A';
      }
    }
  }

  if (!IsMarker(re->op()))
    re->simple_ = re->ComputeSimple();
  re->down_ = stacktop_;
  stacktop_ = re;
  return true;
}